

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1be8a27::AV1Convolve2DIntraBCTest_DISABLED_SpeedTest_Test::TestBody
          (AV1Convolve2DIntraBCTest_DISABLED_SpeedTest_Test *this)

{
  uint src_stride;
  uint h;
  _func_void_uchar_ptr_int_uchar_ptr_int_int_int_InterpFilterParams_ptr_InterpFilterParams_ptr_int_int_ConvolveParams_ptr
  *p_Var1;
  double dVar2;
  __time_t _Var3;
  __suseconds_t _Var4;
  __time_t _Var5;
  __suseconds_t _Var6;
  ParamType *pPVar7;
  uint8_t *src;
  long lVar8;
  long lVar9;
  int iVar10;
  double dVar11;
  aom_usec_timer timer;
  ConvolveParams conv_params_1;
  ConvolveParams conv_params;
  uint8_t test [16384];
  uint8_t reference [16384];
  timeval local_80e0;
  timeval local_80d0;
  ConvolveParams local_80c0;
  ConvolveParams local_8090;
  uchar local_8060 [16384];
  uint8_t local_4060 [16432];
  
  pPVar7 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>_>
           ::GetParam();
  src_stride = (pPVar7->block_).width_;
  pPVar7 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>_>
           ::GetParam();
  h = (pPVar7->block_).height_;
  pPVar7 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>_>
           ::GetParam();
  src = AV1ConvolveTest<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>
        ::RandomInput8((AV1ConvolveTest<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>
                        *)this,(this->super_AV1Convolve2DIntraBCTest).
                               super_AV1ConvolveTest<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>
                               .input8_1_,pPVar7);
  local_8090.is_compound = 0;
  local_8090.use_dist_wtd_comp_avg = 0;
  local_8090.dst = (CONV_BUF_TYPE *)0x0;
  local_8090.dst_stride = 0;
  local_8090.round_0 = 3;
  local_8090.round_1 = 0xb;
  local_8090.plane = 0;
  local_8090.do_average = 0;
  gettimeofday(&local_80e0,(__timezone_ptr_t)0x0);
  iVar10 = 10000;
  do {
    av1_convolve_2d_sr_intrabc_c
              (src,src_stride,local_4060,0x80,src_stride,h,&av1_intrabc_filter_params,
               &av1_intrabc_filter_params,8,8,&local_8090);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  gettimeofday(&local_80d0,(__timezone_ptr_t)0x0);
  _Var6 = local_80d0.tv_usec;
  _Var5 = local_80d0.tv_sec;
  _Var4 = local_80e0.tv_usec;
  _Var3 = local_80e0.tv_sec;
  pPVar7 = testing::
           WithParamInterface<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_const_InterpFilterParams_*,_int,_int,_ConvolveParams_*)>_>
           ::GetParam();
  p_Var1 = pPVar7->test_func_;
  local_80c0.is_compound = 0;
  local_80c0.use_dist_wtd_comp_avg = 0;
  local_80c0.dst = (CONV_BUF_TYPE *)0x0;
  local_80c0.dst_stride = 0;
  local_80c0.round_0 = 3;
  local_80c0.round_1 = 0xb;
  local_80c0.plane = 0;
  local_80c0.do_average = 0;
  gettimeofday(&local_80e0,(__timezone_ptr_t)0x0);
  iVar10 = 10000;
  do {
    (*p_Var1)(src,src_stride,local_8060,0x80,src_stride,h,&av1_intrabc_filter_params,
              &av1_intrabc_filter_params,8,8,&local_80c0);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  lVar9 = _Var6 - _Var4;
  lVar8 = lVar9 + 1000000;
  if (-1 < lVar9) {
    lVar8 = lVar9;
  }
  dVar2 = (double)(lVar8 + ((lVar9 >> 0x3f) + (_Var5 - _Var3)) * 1000000);
  gettimeofday(&local_80d0,(__timezone_ptr_t)0x0);
  lVar9 = local_80d0.tv_usec - local_80e0.tv_usec;
  lVar8 = lVar9 + 1000000;
  if (-1 < lVar9) {
    lVar8 = lVar9;
  }
  dVar11 = (double)(((lVar9 >> 0x3f) + (local_80d0.tv_sec - local_80e0.tv_sec)) * 1000000 + lVar8);
  printf("%d - %d %3dx%-3d:%7.2f/%7.2fns (%3.2f)\n",SUB84(dVar2,0),dVar11,dVar2 / dVar11,3,3,
         (ulong)src_stride,(ulong)h);
  return;
}

Assistant:

TEST_P(AV1Convolve2DIntraBCTest, DISABLED_SpeedTest) { SpeedTest(); }